

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::SimplePolygonMesh::readMeshFromObjFile
          (SimplePolygonMesh *this,istream *in)

{
  pointer *ppVVar1;
  pointer *ppVVar2;
  iterator __position;
  iterator __position_00;
  ulong *puVar3;
  iterator __position_01;
  double dVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  Vector2 *__args;
  ulong *puVar8;
  pointer pvVar9;
  iterator __begin3;
  pointer pvVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> faceCoordInds;
  vector<unsigned_long,_std::allocator<unsigned_long>_> face;
  Vector3 position;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> coords;
  Index index;
  string token;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygonCoordInds;
  string line;
  stringstream ss;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b8;
  vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>> *local_2a0;
  string local_298;
  void *local_278;
  iterator iStack_270;
  Vector2 *local_268;
  Index local_258;
  string local_238;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_218;
  vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
  *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [16];
  Index local_1d0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  clear(this);
  local_1f0 = local_1e0;
  local_1e8 = 0;
  local_268 = (Vector2 *)0x0;
  local_218.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0 = (vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>> *)
              &this->vertexCoordinates;
  local_278 = (void *)0x0;
  iStack_270._M_current = (Vector2 *)0x0;
  local_218.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0[0] = 0;
  while( true ) {
    cVar5 = ::std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
    piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)in,(string *)&local_1f0,cVar5);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
    ::std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f0,_S_out|_S_in);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    local_238._M_string_length = 0;
    local_238.field_2._M_local_buf[0] = '\0';
    ::std::operator>>((istream *)local_1b8,(string *)&local_238);
    iVar6 = ::std::__cxx11::string::compare((char *)&local_238);
    if (iVar6 == 0) {
      piVar7 = ::std::istream::_M_extract<double>((double *)local_1b8);
      piVar7 = ::std::istream::_M_extract<double>((double *)piVar7);
      ::std::istream::_M_extract<double>((double *)piVar7);
      local_298._M_dataplus._M_p =
           (pointer)local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_298._M_string_length =
           (size_type)
           local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_298.field_2._M_allocated_capacity = local_258.position;
      __position._M_current =
           (this->vertexCoordinates).
           super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->vertexCoordinates).
          super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>::
        _M_realloc_insert<geometrycentral::Vector3_const&>
                  (local_2a0,__position,(Vector3 *)&local_298);
      }
      else {
        (__position._M_current)->z = (double)local_258.position;
        (__position._M_current)->x =
             (double)local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        (__position._M_current)->y =
             (double)local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        ppVVar1 = &(this->vertexCoordinates).
                   super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
    }
    else {
      iVar6 = ::std::__cxx11::string::compare((char *)&local_238);
      if (iVar6 == 0) {
        piVar7 = ::std::istream::_M_extract<double>((double *)local_1b8);
        ::std::istream::_M_extract<double>((double *)piVar7);
        local_298._M_dataplus._M_p =
             (pointer)local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        local_298._M_string_length =
             (size_type)
             local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (iStack_270._M_current == local_268) {
          std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::
          _M_realloc_insert<geometrycentral::Vector2>
                    ((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
                     &local_278,iStack_270,(Vector2 *)&local_298);
        }
        else {
          (iStack_270._M_current)->x =
               (double)local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          (iStack_270._M_current)->y =
               (double)local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          iStack_270._M_current = iStack_270._M_current + 1;
        }
      }
      else {
        iVar6 = ::std::__cxx11::string::compare((char *)&local_238);
        if ((iVar6 != 0) &&
           (iVar6 = ::std::__cxx11::string::compare((char *)&local_238), iVar6 == 0)) {
          local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
          local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (unsigned_long *)0x0;
          local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
          while (piVar7 = ::std::operator>>((istream *)local_1b8,(string *)&local_238),
                ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
            anon_unknown_0::parseFaceIndex(&local_258,&local_238);
            if (local_258.position < 0) {
              cVar5 = ::std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
              ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)in,(string *)&local_1f0,cVar5);
              ::std::__cxx11::string::find_first_not_of((char *)&local_1f0,0x295d18,0);
              ::std::__cxx11::string::substr((ulong)&local_298,(ulong)&local_1f0);
              anon_unknown_0::parseFaceIndex(&local_1d0,&local_298);
              local_258.normal = local_1d0.normal;
              local_258.position = local_1d0.position;
              local_258.uv = local_1d0.uv;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p);
              }
            }
            local_298._M_dataplus._M_p = (pointer)local_258.position;
            if (local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&local_2b8,
                         (iterator)
                         local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_298);
            }
            else {
              *local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = local_258.position;
              local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if ((pointer)local_258.uv != (pointer)0xffffffffffffffff) {
              local_298._M_dataplus._M_p = (pointer)local_258.uv;
              if (local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          (&local_2d8,
                           (iterator)
                           local_2d8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,(unsigned_long *)&local_298);
              }
              else {
                *local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish = local_258.uv;
                local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
                local_298._M_dataplus._M_p = (pointer)local_258.uv;
              }
            }
          }
          ::std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)this,&local_2b8);
          if (local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            ::std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::push_back(&local_218,&local_2d8);
          }
          if (local_2d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
            operator_delete(local_2d8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
    ::std::ios_base::~ios_base(local_138);
  }
  local_2a0 = (vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>> *)
              local_218.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_218.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_218.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1f8 = &this->paramCoordinates;
    pvVar10 = local_218.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      __position_00._M_current =
           (this->paramCoordinates).
           super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->paramCoordinates).
          super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
        ::_M_realloc_insert<>(local_1f8,__position_00);
        pvVar9 = (this->paramCoordinates).
                 super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((__position_00._M_current)->
        super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pvVar9 = (this->paramCoordinates).
                 super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->paramCoordinates).
        super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar9;
      }
      puVar8 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar8 != puVar3) {
        do {
          if (*puVar8 < (ulong)((long)iStack_270._M_current - (long)local_278 >> 4)) {
            __position_01._M_current =
                 pvVar9[-1].
                 super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            __args = (Vector2 *)((long)local_278 + *puVar8 * 0x10);
            if (__position_01._M_current ==
                pvVar9[-1].
                super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>>::
              _M_realloc_insert<geometrycentral::Vector2_const&>
                        ((vector<geometrycentral::Vector2,std::allocator<geometrycentral::Vector2>>
                          *)(pvVar9 + -1),__position_01,__args);
            }
            else {
              dVar4 = __args->y;
              (__position_01._M_current)->x = __args->x;
              (__position_01._M_current)->y = dVar4;
              ppVVar2 = &pvVar9[-1].
                         super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppVVar2 = *ppVVar2 + 1;
            }
          }
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar3);
      }
      pvVar10 = pvVar10 + 1;
    } while ((vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>> *)pvVar10 !=
             local_2a0);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_218);
  if (local_278 != (void *)0x0) {
    operator_delete(local_278);
  }
  return;
}

Assistant:

void SimplePolygonMesh::readMeshFromObjFile(std::istream& in) {
  clear();

  // corner UV coords, unpacked below
  std::vector<Vector2> coords;
  std::vector<std::vector<size_t>> polygonCoordInds;

  // parse obj format
  std::string line;
  while (getline(in, line)) {
    std::stringstream ss(line);
    std::string token;

    ss >> token;

    if (token == "v") {
      Vector3 position;
      ss >> position;

      vertexCoordinates.push_back(position);

    } else if (token == "vt") {
      double u, v;
      ss >> u >> v;

      coords.push_back(Vector2{u, v});

    } else if (token == "vn") {
      // Do nothing

    } else if (token == "f") {
      std::vector<size_t> face;
      std::vector<size_t> faceCoordInds;
      while (ss >> token) {
        Index index = parseFaceIndex(token);
        if (index.position < 0) {
          getline(in, line);
          size_t i = line.find_first_not_of("\t\n\v\f\r ");
          index = parseFaceIndex(line.substr(i));
        }

        face.push_back(index.position);

        if (index.uv != -1) {
          faceCoordInds.push_back(index.uv);
        }
      }

      polygons.push_back(face);
      if (!faceCoordInds.empty()) {
        polygonCoordInds.push_back(faceCoordInds);
      }
    }
  }

  // If we got uv coords, unpack them in to per-corner values
  if (!polygonCoordInds.empty()) {
    for (std::vector<size_t>& faceCoordInd : polygonCoordInds) {
      paramCoordinates.emplace_back();
      std::vector<Vector2>& faceCoord = paramCoordinates.back();
      for (size_t i : faceCoordInd) {
        if (i < coords.size()) faceCoord.push_back(coords[i]);
      }
    }
  }
}